

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

DebuggerPropertyDisplayInfo * __thiscall
Js::VariableWalkerBase::AllocateNewPropertyDisplayInfo
          (VariableWalkerBase *this,PropertyId propertyId,Var value,bool isConst,bool isInDeadZone)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  JavascriptLibrary *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  DebuggerPropertyDisplayInfo *this_01;
  uint uVar6;
  TrackAllocData local_58;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_30;
  ArenaAllocator *arena;
  DWORD flags;
  bool isInDeadZone_local;
  bool isConst_local;
  Var value_local;
  VariableWalkerBase *pVStack_10;
  PropertyId propertyId_local;
  VariableWalkerBase *this_local;
  
  arena._6_1_ = isInDeadZone;
  arena._7_1_ = isConst;
  _flags = (JavascriptString *)value;
  value_local._4_4_ = propertyId;
  pVStack_10 = this;
  if (this->pFrame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x21f,"(pFrame)","pFrame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (_flags == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x220,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((arena._6_1_ & 1) == 0) {
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[10])();
    bVar2 = ScriptContext::IsUndeclBlockVar((ScriptContext *)CONCAT44(extraout_var,iVar3),_flags);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x221,
                                  "(isInDeadZone || !pFrame->GetScriptContext()->IsUndeclBlockVar(value))"
                                  ,
                                  "isInDeadZone || !pFrame->GetScriptContext()->IsUndeclBlockVar(value)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  uVar6 = 0;
  if ((arena._6_1_ & 1) != 0) {
    uVar6 = 2;
  }
  arena._0_4_ = uVar6 | (arena._7_1_ & 1) != 0;
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  local_30 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             CONCAT44(extraout_var_00,iVar3);
  if ((arena._6_1_ & 1) != 0) {
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[10])();
    this_00 = ScriptContext::GetLibrary((ScriptContext *)CONCAT44(extraout_var_01,iVar3));
    _flags = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString(this_00);
  }
  pAVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&DebuggerPropertyDisplayInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0x22e);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_58);
  this_01 = (DebuggerPropertyDisplayInfo *)
            new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar5,0x3f67b0);
  DebuggerPropertyDisplayInfo::DebuggerPropertyDisplayInfo
            (this_01,value_local._4_4_,_flags,(uint)arena);
  return this_01;
}

Assistant:

DebuggerPropertyDisplayInfo* VariableWalkerBase::AllocateNewPropertyDisplayInfo(PropertyId propertyId, Var value, bool isConst, bool isInDeadZone)
    {
        Assert(pFrame);
        Assert(value);
        Assert(isInDeadZone || !pFrame->GetScriptContext()->IsUndeclBlockVar(value));

        DWORD flags = DebuggerPropertyDisplayInfoFlags_None;
        flags |= isConst ? DebuggerPropertyDisplayInfoFlags_Const : 0;
        flags |= isInDeadZone ? DebuggerPropertyDisplayInfoFlags_InDeadZone : 0;

        ArenaAllocator *arena = pFrame->GetArena();

        if (isInDeadZone)
        {
            value = pFrame->GetScriptContext()->GetLibrary()->GetDebuggerDeadZoneBlockVariableString();
        }

        return Anew(arena, DebuggerPropertyDisplayInfo, propertyId, value, flags);
    }